

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_umax16_s390x(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ushort uVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    uVar3 = *(ushort *)((long)b + uVar2);
    if (*(ushort *)((long)b + uVar2) < *(ushort *)((long)a + uVar2)) {
      uVar3 = *(ushort *)((long)a + uVar2);
    }
    *(ushort *)((long)d + uVar2) = uVar3;
    uVar2 = uVar2 + 2;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_umax16_s390x_cold_1();
  return;
}

Assistant:

void HELPER(gvec_umax16)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint16_t)) {
        uint16_t aa = *(uint16_t *)((char *)a + i);
        uint16_t bb = *(uint16_t *)((char *)b + i);
        uint16_t dd = aa > bb ? aa : bb;
        *(uint16_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}